

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

ContentStorage * __thiscall
ASDCP::MXF::ContentStorage::InitFromTLVSet(ContentStorage *this,TLVReader *TLVSet)

{
  int iVar1;
  MDDEntry *Object;
  MDDEntry *pMVar2;
  MDDEntry *in_RDX;
  TLVReader local_108;
  TLVReader local_a0;
  undefined1 local_21;
  MDDEntry *local_20;
  TLVReader *TLVSet_local;
  ContentStorage *this_local;
  Result_t *result;
  
  TLVSet_local = TLVSet;
  this_local = this;
  if (TLVSet[1].super_MemIOReader.m_p != (byte_t *)0x0) {
    local_21 = 0;
    local_20 = in_RDX;
    InterchangeObject::InitFromTLVSet(&this->super_InterchangeObject,TLVSet);
    iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    pMVar2 = local_20;
    if (-1 < iVar1) {
      Object = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                MDD_ContentStorage_Packages);
      TLVReader::ReadObject(&local_a0,pMVar2,(IArchive *)Object);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_a0);
      Kumu::Result_t::~Result_t((Result_t *)&local_a0);
    }
    iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (-1 < iVar1) {
      pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                MDD_ContentStorage_EssenceContainerData);
      TLVReader::ReadObject(&local_108,local_20,(IArchive *)pMVar2);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_108);
      Kumu::Result_t::~Result_t((Result_t *)&local_108);
    }
    return this;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x12a,
                "virtual ASDCP::Result_t ASDCP::MXF::ContentStorage::InitFromTLVSet(TLVReader &)");
}

Assistant:

ASDCP::Result_t
ContentStorage::InitFromTLVSet(TLVReader& TLVSet)
{
  assert(m_Dict);
  Result_t result = InterchangeObject::InitFromTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(ContentStorage, Packages));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(ContentStorage, EssenceContainerData));
  return result;
}